

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag,ngram_model_t *lmset,float32 lwf,float32 ascale)

{
  s3wid_t w;
  uint uVar1;
  logmath_t *lmath;
  ngram_model_t *pnVar2;
  ps_lattice_t *ppVar3;
  ps_lattice_t *ppVar4;
  int iVar5;
  int32 iVar6;
  int iVar7;
  ps_latlink_t *ppVar8;
  ps_latlink_s *ppVar9;
  ps_latnode_t *ppVar10;
  latlink_list_t *plVar11;
  uint uVar12;
  ps_latlink_t *ppVar13;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  int32 w3_wid;
  int32 local_6c;
  ngram_model_t *local_68;
  ps_search_t *local_60;
  int32 n_used;
  float32 local_54;
  float32 local_50;
  uint local_4c;
  uint local_48;
  int32 local_44;
  logmath_t *local_40;
  ps_lattice_t *local_38;
  
  lmath = dag->lmath;
  local_60 = dag->search;
  local_68 = lmset;
  local_54 = lwf;
  local_50 = ascale;
  for (ppVar10 = dag->nodes; pnVar2 = local_68, ppVar10 != (ps_latnode_t *)0x0;
      ppVar10 = ppVar10->next) {
    for (plVar11 = ppVar10->exits; plVar11 != (latlink_list_t *)0x0; plVar11 = plVar11->next) {
      plVar11->link->path_scr = -0x80000000;
      iVar5 = logmath_get_zero(lmath);
      plVar11->link->alpha = iVar5;
    }
  }
  plVar11 = dag->start->exits;
  local_40 = lmath;
  if (plVar11 != (latlink_list_t *)0x0) {
    do {
      iVar5 = dict_filler_word(local_60->dict,plVar11->link->to->basewid);
      ppVar8 = plVar11->link;
      if (iVar5 == 0) {
        bVar15 = false;
      }
      else {
        bVar15 = ppVar8->to != dag->end;
      }
      ppVar8->path_scr = ppVar8->ascr;
      if ((pnVar2 != (ngram_model_t *)0x0) && (!bVar15)) {
        iVar6 = ngram_bg_score(pnVar2,ppVar8->to->basewid,local_60->start_wid,&n_used);
        ppVar8 = plVar11->link;
        ppVar8->path_scr = (int)((float)(iVar6 >> 10) * (float)local_54 + (float)ppVar8->path_scr);
      }
      ppVar8->best_prev = (ps_latlink_s *)0x0;
      ppVar8->alpha = 0;
      plVar11 = plVar11->next;
    } while (plVar11 != (latlink_list_s *)0x0);
  }
  ppVar8 = ps_lattice_traverse_edges(dag,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  ppVar4 = dag;
  ppVar3 = local_38;
  while (local_38 = ppVar4, ppVar8 != (ps_latlink_t *)0x0) {
    w3_wid = ppVar8->from->basewid;
    local_6c = ppVar8->to->basewid;
    iVar5 = dict_filler_word(local_60->dict,w3_wid);
    if (iVar5 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (uint)(ppVar8->from != dag->start);
    }
    iVar5 = dict_filler_word(local_60->dict,local_6c);
    if (iVar5 == 0) {
      bVar15 = false;
    }
    else {
      bVar15 = ppVar8->to != dag->end;
    }
    local_44 = 0;
    ppVar9 = ppVar8;
    if ((short)uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      do {
        ppVar13 = ppVar9->best_prev;
        if (ppVar13 == (ps_latlink_t *)0x0) goto LAB_00112a82;
        w3_wid = ppVar13->from->basewid;
        iVar5 = dict_filler_word(local_60->dict,w3_wid);
        ppVar9 = ppVar13;
      } while ((iVar5 != 0) && (ppVar13->from != dag->start));
      uVar12 = 0;
    }
LAB_00112a82:
    if (((short)uVar12 == 0 && local_68 != (ngram_model_t *)0x0) && !bVar15) {
      local_44 = ngram_ng_prob(local_68,local_6c,&w3_wid,1,&n_used);
    }
    pnVar2 = local_68;
    ppVar8->alpha = (int)((float)(ppVar8->ascr << 10) * (float)local_50 + (float)ppVar8->alpha);
    if (bVar15) {
      ppVar10 = (ps_latnode_t *)(ulong)(uint)w3_wid;
      local_6c = w3_wid;
      do {
        ppVar9 = ppVar9->best_prev;
        if (ppVar9 == (ps_latlink_s *)0x0) {
          local_4c = (uint)CONCAT62((int6)((ulong)ppVar10 >> 0x10),1);
          local_48 = uVar12;
          goto LAB_00112b48;
        }
        w3_wid = ppVar9->from->basewid;
        iVar5 = dict_filler_word(local_60->dict,w3_wid);
      } while ((iVar5 != 0) && (ppVar10 = ppVar9->from, ppVar10 != dag->start));
      local_4c = 0;
      local_48 = uVar12;
    }
    else {
      local_48 = 0;
      local_4c = uVar12;
    }
LAB_00112b48:
    for (plVar11 = ppVar8->to->exits; plVar11 != (latlink_list_t *)0x0; plVar11 = plVar11->next) {
      w = plVar11->link->to->basewid;
      iVar5 = dict_filler_word(local_60->dict,w);
      if (iVar5 == 0) {
        bVar15 = false;
      }
      else {
        bVar15 = plVar11->link->to != dag->end;
      }
      bVar16 = pnVar2 != (ngram_model_t *)0x0;
      iVar5 = logmath_add(local_40,plVar11->link->alpha,ppVar8->alpha + local_44);
      pnVar2 = local_68;
      ppVar13 = plVar11->link;
      ppVar13->alpha = iVar5;
      iVar5 = ppVar13->ascr + ppVar8->path_scr;
      if ((!bVar15 && (local_48 & 1) == 0) && bVar16) {
        if ((short)local_4c == 0) {
          iVar7 = ngram_tg_score(local_68,w,local_6c,w3_wid,&n_used);
        }
        else {
          iVar7 = ngram_bg_score(local_68,w,local_6c,&n_used);
        }
        iVar5 = (int)((float)(iVar7 >> 10) * (float)local_54 + (float)iVar5);
      }
      ppVar13 = plVar11->link;
      if (ppVar13->path_scr < iVar5) {
        ppVar13->path_scr = iVar5;
        ppVar13->best_prev = ppVar8;
      }
      dag = local_38;
    }
    ppVar8 = ps_lattice_traverse_next(dag,(ps_latnode_t *)0x0);
    ppVar4 = local_38;
    ppVar3 = local_38;
  }
  local_38 = ppVar3;
  iVar5 = logmath_get_zero(local_40);
  dag->norm = iVar5;
  plVar11 = dag->end->entries;
  uVar12 = 0x80000000;
  ppVar8 = (ps_latlink_t *)0x0;
  if (plVar11 != (latlink_list_t *)0x0) {
    do {
      w3_wid = plVar11->link->from->basewid;
      iVar5 = dict_filler_word(local_60->dict,w3_wid);
      if (iVar5 != 0) {
        ppVar13 = plVar11->link;
        do {
          if (ppVar13->from == dag->start) break;
          ppVar13 = ppVar13->best_prev;
          if (ppVar13 == (ps_latlink_s *)0x0) goto LAB_00112d0b;
          w3_wid = ppVar13->from->basewid;
          iVar5 = dict_filler_word(local_60->dict,w3_wid);
        } while (iVar5 != 0);
      }
      if (local_68 == (ngram_model_t *)0x0) {
LAB_00112d0b:
        iVar6 = 0;
      }
      else {
        iVar6 = ngram_ng_prob(local_68,plVar11->link->to->basewid,&w3_wid,1,&n_used);
      }
      iVar5 = logmath_add(local_40,dag->norm,iVar6 + plVar11->link->alpha);
      dag->norm = iVar5;
      uVar1 = plVar11->link->path_scr;
      if ((int)uVar12 < (int)uVar1) {
        ppVar8 = plVar11->link;
        uVar12 = uVar1;
      }
      plVar11 = plVar11->next;
    } while (plVar11 != (latlink_list_s *)0x0);
  }
  dag->norm = (int)((float)(dag->final_node_ascr << 10) * (float)local_50 + (float)iVar5);
  pcVar14 = (char *)0x0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x566,"Bestpath score: %d\n",(ulong)uVar12);
  ppVar10 = dag->end;
  if (-1 < (long)ppVar10->wid) {
    pcVar14 = dag->search->dict->word[ppVar10->wid].word;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x56a,"Normalizer P(O) = alpha(%s:%d:%d) = %d\n",pcVar14,(ulong)(uint)ppVar10->sf,
          (ulong)(uint)ppVar10->lef,(ulong)(uint)dag->norm);
  return ppVar8;
}

Assistant:

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag, ngram_model_t *lmset,
                    float32 lwf, float32 ascale)
{
    ps_search_t *search;
    ps_latnode_t *node;
    ps_latlink_t *link;
    ps_latlink_t *bestend;
    latlink_list_t *x;
    logmath_t *lmath;
    int32 bestescr;

    search = dag->search;
    lmath = dag->lmath;

    /* Initialize path scores for all links exiting dag->start, and
     * set all other scores to the minimum.  Also initialize alphas to
     * log-zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->path_scr = MAX_NEG_INT32;
            x->link->alpha = logmath_get_zero(lmath);
        }
    }
    for (x = dag->start->exits; x; x = x->next) {
        int32 n_used;
        int16 to_is_fil;

        to_is_fil = dict_filler_word(ps_search_dict(search), x->link->to->basewid) && x->link->to != dag->end;

        /* Best path points to dag->start, obviously. */
        x->link->path_scr = x->link->ascr;
        if (lmset && !to_is_fil)
            x->link->path_scr += (ngram_bg_score(lmset, x->link->to->basewid,
                                ps_search_start_wid(search), &n_used) >> SENSCR_SHIFT) * lwf;
        x->link->best_prev = NULL;
        /* No predecessors for start links. */
        x->link->alpha = 0;
    }

    /* Traverse the edges in the graph, updating path scores. */
    for (link = ps_lattice_traverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_traverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 w3_wid, w2_wid;
        int16 w3_is_fil, w2_is_fil;
        ps_latlink_t *prev_link;

        /* Sanity check, we should not be traversing edges that
         * weren't previously updated, otherwise nasty overflows will result. */
        assert(link->path_scr != MAX_NEG_INT32);

        /* Find word predecessor if from-word is filler */
        w3_wid = link->from->basewid;
        w2_wid = link->to->basewid;
        w3_is_fil = dict_filler_word(ps_search_dict(search), link->from->basewid) && link->from != dag->start;
        w2_is_fil = dict_filler_word(ps_search_dict(search), w2_wid) && link->to != dag->end;
        prev_link = link;

        if (w3_is_fil) {
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate common bigram probability for all alphas. */
        if (lmset && !w3_is_fil && !w2_is_fil)
            bprob = ngram_ng_prob(lmset, w2_wid, &w3_wid, 1, &n_used);
        else
            bprob = 0;
        /* Add in this link's acoustic score, which was a constant
           factor in previous computations (if any). */
        link->alpha += (link->ascr << SENSCR_SHIFT) * ascale;

        if (w2_is_fil) {
            w2_is_fil = w3_is_fil;
            w3_is_fil = TRUE;
            w2_wid = w3_wid;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Update scores for all paths exiting link->to. */
        for (x = link->to->exits; x; x = x->next) {
            int32 score;
            int32 w1_wid;
            int16 w1_is_fil;

            w1_wid = x->link->to->basewid;
            w1_is_fil = dict_filler_word(ps_search_dict(search), w1_wid) && x->link->to != dag->end;

            /* Update alpha with sum of previous alphas. */
            x->link->alpha = logmath_add(lmath, x->link->alpha, link->alpha + bprob);

            /* Update link score with maximum link score. */
            score = link->path_scr + x->link->ascr;
            /* Calculate language score for bestpath if possible */
            if (lmset && !w1_is_fil && !w2_is_fil) {
                if (w3_is_fil)
                    /* partial context available */
                    score += (ngram_bg_score(lmset, w1_wid, w2_wid, &n_used) >> SENSCR_SHIFT) * lwf;
                else
                    /* full context available */
                    score += (ngram_tg_score(lmset, w1_wid, w2_wid, w3_wid, &n_used) >> SENSCR_SHIFT) * lwf;
            }

            if (score BETTER_THAN x->link->path_scr) {
                x->link->path_scr = score;
                x->link->best_prev = link;
            }
        }
    }

    /* Find best link entering final node, and calculate normalizer
     * for posterior probabilities. */
    bestend = NULL;
    bestescr = MAX_NEG_INT32;

    /* Normalizer is the alpha for the imaginary link exiting the
       final node. */
    dag->norm = logmath_get_zero(lmath);
    for (x = dag->end->entries; x; x = x->next) {
        int32 bprob, n_used;
        int32 from_wid;
        int16 from_is_fil;

        from_wid = x->link->from->basewid;
        from_is_fil = dict_filler_word(ps_search_dict(search), from_wid) && x->link->from != dag->start;
        if (from_is_fil) {
            ps_latlink_t *prev_link = x->link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        if (lmset && !from_is_fil)
            bprob = ngram_ng_prob(lmset,
                                  x->link->to->basewid,
                                  &from_wid, 1, &n_used);
        else
            bprob = 0;
        dag->norm = logmath_add(lmath, dag->norm, x->link->alpha + bprob);
        if (x->link->path_scr BETTER_THAN bestescr) {
            bestescr = x->link->path_scr;
            bestend = x->link;
        }
    }
    /* FIXME: floating point... */
    /* FIXME: possible under/overflow!!! */
    dag->norm += (int32)(dag->final_node_ascr << SENSCR_SHIFT) * ascale;

    E_INFO("Bestpath score: %d\n", bestescr);
    E_INFO("Normalizer P(O) = alpha(%s:%d:%d) = %d\n",
           dict_wordstr(dag->search->dict, dag->end->wid),
           dag->end->sf, dag->end->lef,
           dag->norm);
    return bestend;
}